

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFontAtlas::CalcCustomRectUV
          (ImFontAtlas *this,CustomRect *rect,ImVec2 *out_uv_min,ImVec2 *out_uv_max)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  
  if ((0 < this->TexWidth) && (0 < this->TexHeight)) {
    if (rect->X != 0xffff) {
      uVar2 = rect->Y;
      fVar1 = (this->TexUvScale).y;
      out_uv_min->x = (float)rect->X * (this->TexUvScale).x;
      out_uv_min->y = (float)uVar2 * fVar1;
      uVar2 = rect->Y;
      uVar3 = rect->Height;
      fVar1 = (this->TexUvScale).y;
      out_uv_max->x = (float)((uint)rect->Width + (uint)rect->X) * (this->TexUvScale).x;
      out_uv_max->y = (float)((uint)uVar3 + (uint)uVar2) * fVar1;
      return;
    }
    __assert_fail("rect->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x66a,
                  "void ImFontAtlas::CalcCustomRectUV(const CustomRect *, ImVec2 *, ImVec2 *)");
  }
  __assert_fail("TexWidth > 0 && TexHeight > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                ,0x669,"void ImFontAtlas::CalcCustomRectUV(const CustomRect *, ImVec2 *, ImVec2 *)")
  ;
}

Assistant:

void ImFontAtlas::CalcCustomRectUV(const CustomRect* rect, ImVec2* out_uv_min, ImVec2* out_uv_max)
{
    IM_ASSERT(TexWidth > 0 && TexHeight > 0);   // Font atlas needs to be built before we can calculate UV coordinates
    IM_ASSERT(rect->IsPacked());                // Make sure the rectangle has been packed
    *out_uv_min = ImVec2((float)rect->X * TexUvScale.x, (float)rect->Y * TexUvScale.y);
    *out_uv_max = ImVec2((float)(rect->X + rect->Width) * TexUvScale.x, (float)(rect->Y + rect->Height) * TexUvScale.y);
}